

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O1

void ncnn::conv1x1s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  float *pfVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  float *pfVar25;
  float *pfVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  float *pfVar32;
  float *pfVar33;
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int remain;
  
  auVar15 = _DAT_001334a0;
  auVar14 = _DAT_00133490;
  auVar13 = _DAT_00133420;
  iVar2 = top_blob->c;
  if (0 < (long)iVar2) {
    uVar3 = bottom_blob->c;
    lVar17 = (long)(int)uVar3;
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar6 = _kernel->data;
    pvVar7 = _bias->data;
    iVar22 = bottom_blob->w * 2 + iVar4 * -2;
    lVar24 = top_blob->cstep * top_blob->elemsize;
    pvVar8 = top_blob->data;
    uVar16 = top_blob->h * top_blob->w;
    lVar18 = (ulong)uVar16 - 1;
    auVar34._8_4_ = (int)lVar18;
    auVar34._0_8_ = lVar18;
    auVar34._12_4_ = (int)((ulong)lVar18 >> 0x20);
    pvVar9 = bottom_blob->data;
    lVar29 = bottom_blob->cstep * bottom_blob->elemsize;
    lVar18 = (long)pvVar8 + 0xc;
    auVar34 = auVar34 ^ _DAT_00133420;
    lVar27 = 0;
    do {
      if (pvVar7 == (void *)0x0) {
        uVar35 = 0;
      }
      else {
        uVar35 = *(undefined4 *)((long)pvVar7 + lVar27 * 4);
      }
      if (0 < (int)uVar16) {
        uVar19 = 0;
        do {
          auVar36._8_4_ = (int)uVar19;
          auVar36._0_8_ = uVar19;
          auVar36._12_4_ = (int)(uVar19 >> 0x20);
          auVar37 = (auVar36 | auVar15) ^ auVar13;
          iVar28 = auVar34._4_4_;
          if ((bool)(~(iVar28 < auVar37._4_4_ ||
                      auVar34._0_4_ < auVar37._0_4_ && auVar37._4_4_ == iVar28) & 1)) {
            *(undefined4 *)(lVar18 + -0xc + uVar19 * 4) = uVar35;
          }
          if (auVar37._12_4_ <= auVar34._12_4_ &&
              (auVar37._8_4_ <= auVar34._8_4_ || auVar37._12_4_ != auVar34._12_4_)) {
            *(undefined4 *)(lVar18 + -8 + uVar19 * 4) = uVar35;
          }
          auVar36 = (auVar36 | auVar14) ^ auVar13;
          iVar23 = auVar36._4_4_;
          if (iVar23 <= iVar28 && (iVar23 != iVar28 || auVar36._0_4_ <= auVar34._0_4_)) {
            *(undefined4 *)(lVar18 + -4 + uVar19 * 4) = uVar35;
            *(undefined4 *)(lVar18 + uVar19 * 4) = uVar35;
          }
          uVar19 = uVar19 + 4;
        } while ((uVar16 + 3 & 0xfffffffc) != uVar19);
      }
      pfVar25 = (float *)(lVar24 * lVar27 + (long)pvVar8);
      uVar19 = 0;
      if (3 < (int)uVar3) {
        uVar30 = 0;
        do {
          if (0 < iVar5) {
            pfVar20 = (float *)((long)pvVar6 + uVar30 * 4 + lVar27 * lVar17 * 4);
            fVar1 = *pfVar20;
            fVar10 = pfVar20[1];
            fVar11 = pfVar20[2];
            fVar12 = pfVar20[3];
            pfVar21 = (float *)((uVar30 | 3) * lVar29 + (long)pvVar9);
            pfVar32 = (float *)((uVar30 | 2) * lVar29 + (long)pvVar9);
            pfVar20 = (float *)((uVar30 | 1) * lVar29 + (long)pvVar9);
            pfVar26 = (float *)(lVar29 * uVar30 + (long)pvVar9);
            iVar28 = 0;
            pfVar33 = pfVar25;
            do {
              iVar23 = iVar4 + 1;
              if (0 < iVar4) {
                do {
                  *pfVar33 = *pfVar21 * fVar12 + *pfVar20 * fVar10 +
                             *pfVar32 * fVar11 + *pfVar26 * fVar1 + *pfVar33;
                  pfVar26 = pfVar26 + 2;
                  pfVar20 = pfVar20 + 2;
                  pfVar32 = pfVar32 + 2;
                  pfVar21 = pfVar21 + 2;
                  pfVar33 = pfVar33 + 1;
                  iVar23 = iVar23 + -1;
                } while (1 < iVar23);
              }
              pfVar26 = pfVar26 + iVar22;
              pfVar20 = pfVar20 + iVar22;
              pfVar32 = pfVar32 + iVar22;
              pfVar21 = pfVar21 + iVar22;
              iVar28 = iVar28 + 1;
            } while (iVar28 != iVar5);
          }
          uVar19 = uVar30 + 4;
          lVar31 = uVar30 + 7;
          uVar30 = uVar19;
        } while (lVar31 < lVar17);
      }
      if ((int)uVar19 < (int)uVar3) {
        uVar19 = uVar19 & 0xffffffff;
        do {
          if (0 < iVar5) {
            fVar1 = *(float *)((long)pvVar6 + uVar19 * 4 + lVar27 * lVar17 * 4);
            pfVar20 = (float *)(lVar29 * uVar19 + (long)pvVar9);
            iVar28 = 0;
            pfVar32 = pfVar25;
            do {
              iVar23 = iVar4 + 1;
              if (0 < iVar4) {
                do {
                  *pfVar32 = *pfVar20 * fVar1 + *pfVar32;
                  pfVar20 = pfVar20 + 2;
                  pfVar32 = pfVar32 + 1;
                  iVar23 = iVar23 + -1;
                } while (1 < iVar23);
              }
              pfVar20 = pfVar20 + iVar22;
              iVar28 = iVar28 + 1;
            } while (iVar28 != iVar5);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar3);
      }
      lVar27 = lVar27 + 1;
      lVar18 = lVar18 + lVar24;
    } while (lVar27 != iVar2);
  }
  return;
}

Assistant:

static void conv1x1s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;
                    float sum1 = *r1 * k1;
                    float sum2 = *r2 * k2;
                    float sum3 = *r3 * k3;

                    *outptr += sum + sum1 + sum2 + sum3;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;

                    *outptr += sum;

                    r0 += 2;
                    outptr++;
                }

                r0 += tailstep;
            }

        }
    }

}